

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O1

int csp_rdp_close_internal(csp_conn_t *conn,uint8_t closed_by,_Bool send_rst)

{
  uint8_t *puVar1;
  byte bVar2;
  csp_rdp_state_t cVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  
  cVar3 = (conn->rdp).state;
  iVar7 = 0;
  if (cVar3 != RDP_CLOSED) {
    puVar1 = &(conn->rdp).closed_by;
    *puVar1 = *puVar1 | closed_by;
    if (cVar3 != RDP_CLOSE_WAIT) {
      (conn->rdp).state = RDP_CLOSE_WAIT;
      uVar4 = csp_get_ms();
      conn->timestamp = uVar4;
      if (send_rst) {
        csp_rdp_send_cmp(conn,(csp_packet_t *)0x0,5,(uint)(conn->rdp).snd_nxt,
                         (uint)(conn->rdp).rcv_cur);
      }
      if (1 < csp_dbg_rdp_print) {
        pcVar5 = "";
        if (send_rst) {
          pcVar5 = ", sent RST";
        }
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x)%s -> CLOSE_WAIT\n\x1b[0m",conn,closed_by
                       ,pcVar5);
      }
      csp_bin_sem_post(&(conn->rdp).tx_wait);
    }
    bVar2 = (conn->rdp).closed_by;
    if (bVar2 == 7) {
      if (1 < csp_dbg_rdp_print) {
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x) -> CLOSED\n\x1b[0m",conn,closed_by);
      }
      (conn->rdp).state = RDP_CLOSED;
      (conn->rdp).closed_by = '\0';
      iVar7 = 0;
    }
    else {
      iVar7 = -0xc;
      if (1 < csp_dbg_rdp_print) {
        pcVar5 = " userspace";
        if ((bVar2 & 1) != 0) {
          pcVar5 = "";
        }
        pcVar8 = " protocol";
        if ((bVar2 & 2) != 0) {
          pcVar8 = "";
        }
        pcVar6 = " timeout";
        if ((bVar2 & 4) != 0) {
          pcVar6 = "";
        }
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x) != %x, waiting for:%s%s%s\n\x1b[0m",conn
                       ,closed_by,(ulong)bVar2,pcVar5,pcVar8,pcVar6);
      }
    }
  }
  return iVar7;
}

Assistant:

static int csp_rdp_close_internal(csp_conn_t * conn, uint8_t closed_by, bool send_rst) {

	if (conn->rdp.state == RDP_CLOSED) {
		return CSP_ERR_NONE;
	}

	conn->rdp.closed_by |= closed_by;

	/* If connection is open, send reset */
	if (conn->rdp.state != RDP_CLOSE_WAIT) {
		conn->rdp.state = RDP_CLOSE_WAIT;
		conn->timestamp = csp_get_ms();
		if (send_rst) {
			csp_rdp_send_cmp(conn, NULL, RDP_ACK | RDP_RST, conn->rdp.snd_nxt, conn->rdp.rcv_cur);
		}
		csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x)%s -> CLOSE_WAIT\n", (void *)conn, closed_by, send_rst ? ", sent RST" : "");
		csp_bin_sem_post(&conn->rdp.tx_wait);  // wake up any pendng Tx
	}

	if (conn->rdp.closed_by != CSP_RDP_CLOSED_BY_ALL) {
		csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x) != %x, waiting for:%s%s%s\n",
						 (void *)conn, closed_by, conn->rdp.closed_by,
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_USERSPACE) ? "" : " userspace",
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_PROTOCOL) ? "" : " protocol",
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_TIMEOUT) ? "" : " timeout");
		return CSP_ERR_AGAIN;
	}

	csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x) -> CLOSED\n", (void *)conn, closed_by);
	conn->rdp.state = RDP_CLOSED;
	conn->rdp.closed_by = 0;
	return CSP_ERR_NONE;
}